

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O0

void deqp::gles2::Performance::writeLoopWorkload
               (ostringstream *stream,char *resultName,char *operandName)

{
  ostream *poVar1;
  int local_28;
  int i;
  int numMultiplications;
  char *operandName_local;
  char *resultName_local;
  ostringstream *stream_local;
  
  poVar1 = std::operator<<((ostream *)stream,resultName);
  std::operator<<(poVar1," = ");
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    if (0 < local_28) {
      std::operator<<((ostream *)stream," * ");
    }
    poVar1 = std::operator<<((ostream *)stream,"(");
    poVar1 = std::operator<<(poVar1,resultName);
    poVar1 = std::operator<<(poVar1," + ");
    poVar1 = std::operator<<(poVar1,operandName);
    std::operator<<(poVar1,")");
  }
  std::operator<<((ostream *)stream,";");
  return;
}

Assistant:

static void writeLoopWorkload (std::ostringstream& stream, const char* resultName, const char* operandName)
{
	const int numMultiplications = 8;

	stream << resultName << " = ";

	for (int i = 0; i < numMultiplications; i++)
	{
		if (i > 0)
			stream << " * ";

		stream << "(" << resultName << " + " << operandName << ")";
	}

	stream << ";";
}